

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O1

GraphNode * raviX_add_node(Graph *g,nodeId_t index)

{
  uint uVar1;
  GraphNode **ppGVar2;
  GraphNode *pGVar3;
  
  uVar1 = g->allocated;
  if (index < uVar1) {
    if (g->nodes[index] != (GraphNode *)0x0) {
      return g->nodes[index];
    }
    if (index < uVar1) goto LAB_0010c669;
  }
  ppGVar2 = (GraphNode **)raviX_realloc_array(g->nodes,8,(ulong)uVar1,(ulong)(index + 8));
  g->allocated = index + 8;
  g->nodes = ppGVar2;
LAB_0010c669:
  if (g->allocated <= index) {
    __assert_fail("index < g->allocated",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                  ,199,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
  }
  pGVar3 = (GraphNode *)(*g->node_allocator->calloc)(g->node_allocator->arena,1,0x30);
  if (pGVar3->pre == 0) {
    if (pGVar3->rpost == 0) {
      *(undefined4 *)&pGVar3->preds = 0;
      (pGVar3->preds).links = (GraphNodeLink *)0x0;
      *(undefined4 *)&pGVar3->succs = 0;
      (pGVar3->succs).links = (GraphNodeLink *)0x0;
      pGVar3->index = index;
      g->nodes[index] = pGVar3;
      return pGVar3;
    }
    __assert_fail("n->rpost == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                  ,0xca,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
  }
  __assert_fail("n->pre == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                ,0xc9,"GraphNode *raviX_add_node(Graph *, nodeId_t)");
}

Assistant:

static GraphNode *raviX_add_node(Graph *g, nodeId_t index)
{
	if (index < g->allocated && g->nodes[index] != NULL) {
		// already allocated
		return g->nodes[index];
	}
	if (index >= g->allocated) {
		raviX_graph_grow(g, index);
	}
	assert(index < g->allocated);
	GraphNode *n = (GraphNode *) g->node_allocator->calloc(g->node_allocator->arena, 1, sizeof(GraphNode));
	assert(n->pre == 0);
	assert(n->rpost == 0);
	node_list_init(&n->preds);
	node_list_init(&n->succs);
	/* note that each node must have an index such that n = nodes[index] */
	n->index = index;
	g->nodes[index] = n;
	return n;
}